

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddTargetItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmake *this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  TargetType TVar5;
  uint uVar6;
  int iVar7;
  string *args_1;
  ulong uVar8;
  FrameworkDescriptor *pFVar9;
  char *__s;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar10;
  byte local_2b1;
  byte local_239;
  allocator<char> local_229;
  string local_228;
  FeatureDescriptor *local_208;
  ItemIsPath local_200;
  byte local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  FeatureDescriptor *local_1d8;
  ItemIsPath local_1cc;
  FeatureDescriptor *local_1c8;
  ItemIsPath local_1bc;
  string local_1b8;
  string_view local_198;
  string_view local_188;
  string_view local_170;
  undefined4 local_160;
  char local_159;
  cmAlphaNum local_158;
  cmAlphaNum local_128;
  string local_f8;
  undefined1 local_d8 [8];
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  string local_58;
  _Base_ptr local_38;
  undefined1 local_30;
  cmGeneratorTarget *local_28;
  cmGeneratorTarget *target;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  local_28 = entry->Target;
  target = (cmGeneratorTarget *)entry;
  item = &entry->Item;
  entry_local = (LinkEntry *)this;
  TVar5 = cmGeneratorTarget::GetType(local_28);
  if (TVar5 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar5 = cmGeneratorTarget::GetType(local_28);
  if (TVar5 == SHARED_LIBRARY) {
    pVar10 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert(&this->SharedLibrariesLinked,&local_28);
    local_38 = (_Base_ptr)pVar10.first._M_node;
    local_30 = pVar10.second;
  }
  if (((this->NoSONameUsesPath & 1U) == 0) ||
     (bVar2 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(local_28,&this->Config), !bVar2))
  {
    bVar2 = false;
    local_239 = 0;
    if ((this->OldLinkDirMode & 1U) != 0) {
      bVar3 = cmGeneratorTarget::IsFrameworkOnApple(local_28);
      local_239 = 0;
      if (!bVar3) {
        cmsys::SystemTools::GetFilenamePath(&local_58,(string *)target);
        bVar2 = true;
        bVar3 = ::cm::
                contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&this->OldLinkDirMask,&local_58);
        local_239 = bVar3 ^ 0xff;
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    if ((local_239 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,(value_type *)target);
    }
    bVar2 = cmGeneratorTarget::IsFrameworkOnApple(local_28);
    if ((bVar2) &&
       (uVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])(), (uVar6 & 1) == 0)) {
      cmGlobalGenerator::SplitFrameworkPath
                ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_d8,this->GlobalGenerator,
                 (string *)target,Extended);
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_d8);
      if (bVar2) {
        std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                  ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_d8);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          pFVar9 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                             ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_d8);
          AddFrameworkPath(this,&pFVar9->Directory);
        }
        local_170 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)item[1].Value.field_2._M_local_buf);
        local_198 = (string_view)::cm::operator____s("FRAMEWORK",9);
        local_188 = local_198;
        bVar2 = cmHasSuffix(local_170,local_198);
        pcVar1 = target;
        if (bVar2) {
          pFVar9 = std::optional<cmGlobalGenerator::FrameworkDescriptor>::operator->
                             ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_d8);
          cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_(&local_1b8,pFVar9);
          local_1bc = Yes;
          local_1c8 = FindLibraryFeature(this,(string *)&item[1].Value.field_2);
          std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
          ::
          emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                    ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                      *)this,&local_1b8,&local_1bc,&local_28,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1b8);
        }
        else {
          local_1cc = Yes;
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&item[1].Value.field_2,
                                  &cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
          local_1fa = 0;
          if (_Var4) {
            std::allocator<char>::allocator();
            local_1fa = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f8,"__CMAKE_LINK_LIBRARY",&local_1f9);
          }
          else {
            std::__cxx11::string::string
                      ((string *)&local_1f8,(string *)item[1].Value.field_2._M_local_buf);
          }
          local_1d8 = FindLibraryFeature(this,&local_1f8);
          std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
          ::
          emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                    ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                      *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)pcVar1,&local_1cc,&local_28,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
          if ((local_1fa & 1) != 0) {
            std::allocator<char>::~allocator(&local_1f9);
          }
        }
        local_160 = 0;
      }
      else {
        this_00 = this->CMakeInstance;
        cmAlphaNum::cmAlphaNum(&local_128,"Could not parse framework path \"");
        cmAlphaNum::cmAlphaNum(&local_158,(string *)target);
        args_1 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        local_159 = '.';
        cmStrCat<char[20],std::__cxx11::string,char>
                  (&local_f8,&local_128,&local_158,(char (*) [20])"\" linked by target ",args_1,
                   &local_159);
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_f8,
                            (cmListFileBacktrace *)&target->ObjectDirectory);
        std::__cxx11::string::~string((string *)&local_f8);
        local_160 = 1;
      }
      std::optional<cmGlobalGenerator::FrameworkDescriptor>::~optional
                ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_d8);
    }
    else {
      pcVar1 = target;
      local_200 = Yes;
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &item[1].Value.field_2,
                              &cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
      bVar2 = false;
      if (_Var4) {
        bVar2 = cmGeneratorTarget::IsFrameworkOnApple(local_28);
        local_2b1 = 0;
        if (bVar2) {
          iVar7 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
          local_2b1 = (byte)iVar7;
        }
        __s = "__CMAKE_LINK_LIBRARY";
        if ((local_2b1 & 1) != 0) {
          __s = "__CMAKE_LINK_FRAMEWORK";
        }
        std::allocator<char>::allocator();
        bVar2 = true;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,__s,&local_229);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_228,(string *)item[1].Value.field_2._M_local_buf);
      }
      local_208 = FindLibraryFeature(this,&local_228);
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)pcVar1,&local_200,&local_28,&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      if (bVar2) {
        std::allocator<char>::~allocator(&local_229);
      }
    }
  }
  else {
    AddSharedLibNoSOName(this,(LinkEntry *)item);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(LinkEntry const& entry)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  BT<std::string> const& item = entry.Item;
  cmGeneratorTarget const* target = entry.Target;

  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(entry);
    return;
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      !cm::contains(this->OldLinkDirMask,
                    cmSystemTools::GetFilenamePath(item.Value))) {
    this->OldLinkDirItems.push_back(item.Value);
  }

  if (target->IsFrameworkOnApple() && !this->GlobalGenerator->IsXcode()) {
    // Add the framework directory and the framework item itself
    auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
      item.Value, cmGlobalGenerator::FrameworkFormat::Extended);
    if (!fwDescriptor) {
      this->CMakeInstance->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Could not parse framework path \"", item.Value,
                 "\" linked by target ", this->Target->GetName(), '.'),
        item.Backtrace);
      return;
    }
    if (!fwDescriptor->Directory.empty()) {
      // Add the directory portion to the framework search path.
      this->AddFrameworkPath(fwDescriptor->Directory);
    }
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s)) {
      this->Items.emplace_back(fwDescriptor->GetLinkName(), ItemIsPath::Yes,
                               target,
                               this->FindLibraryFeature(entry.Feature));
    } else {
      this->Items.emplace_back(
        item, ItemIsPath::Yes, target,
        this->FindLibraryFeature(
          entry.Feature == DEFAULT ? "__CMAKE_LINK_LIBRARY" : entry.Feature));
    }
  } else {
    // Now add the full path to the library.
    this->Items.emplace_back(
      item, ItemIsPath::Yes, target,
      this->FindLibraryFeature(
        entry.Feature == DEFAULT
          ? (target->IsFrameworkOnApple() && this->GlobalGenerator->IsXcode()
               ? "__CMAKE_LINK_FRAMEWORK"
               : "__CMAKE_LINK_LIBRARY")
          : entry.Feature));
  }
}